

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O1

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker stroker,SW_FT_Outline *outline)

{
  SW_FT_Bool SVar1;
  SW_FT_Pos *pSVar2;
  SW_FT_Error SVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  SW_FT_Vector *pSVar8;
  SW_FT_Vector *pSVar9;
  char *pcVar10;
  char *pcVar11;
  SW_FT_Vector *pSVar12;
  SW_FT_Vector *pSVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  SW_FT_Vector vec;
  SW_FT_Vector v_start;
  SW_FT_Vector vec2;
  SW_FT_Vector v_control;
  SW_FT_Vector vec_1;
  SW_FT_Vector local_b8;
  SW_FT_Vector local_a8;
  undefined4 uStack_98;
  int iStack_94;
  SW_FT_Outline *local_90;
  SW_FT_Vector local_88;
  SW_FT_Vector local_78;
  SW_FT_Vector *local_60;
  SW_FT_Vector *local_58;
  ulong local_50;
  SW_FT_Vector local_48;
  
  SVar3 = -1;
  if (stroker != (SW_FT_Stroker)0x0 && outline != (SW_FT_Outline *)0x0) {
    SVar3 = 0;
    stroker->borders[0].num_points = 0;
    stroker->borders[0].start = -1;
    stroker->borders[0].valid = '\0';
    stroker->borders[1].num_points = 0;
    stroker->borders[1].start = -1;
    stroker->borders[1].valid = '\0';
    if (0 < outline->n_contours) {
      local_58 = &stroker->center;
      local_60 = &stroker->subpath_start;
      lVar5 = 0;
      uVar6 = 0;
      local_90 = outline;
      do {
        uVar7 = (uint)outline->contours[lVar5];
        local_50 = (ulong)uVar7;
        if (uVar6 < uVar7) {
          pSVar12 = outline->points;
          pSVar9 = pSVar12 + local_50;
          lVar15 = pSVar12[uVar6].x;
          local_a8.y = pSVar12[uVar6].y;
          local_a8.x = pSVar9->x;
          pSVar2 = &pSVar9->y;
          local_78.x = pSVar12[uVar6].x;
          local_78.y = pSVar12[uVar6].y;
          pcVar11 = outline->tags;
          if ((pcVar11[uVar6] & 3U) == 2) {
            iVar4 = 5;
          }
          else {
            pSVar12 = pSVar12 + uVar6;
            pcVar10 = pcVar11 + uVar6;
            if ((pcVar11[uVar6] & 3U) == 0) {
              if ((pcVar11[local_50] & 3U) == 1) {
                pSVar9 = pSVar9 + -1;
                local_a8.y = *pSVar2;
              }
              else {
                local_a8.x = local_a8.x + lVar15;
                lVar15 = *pSVar2 + local_a8.y;
                uVar16 = local_a8.x - (local_a8.x >> 0x3f);
                uVar17 = lVar15 - (lVar15 >> 0x3f);
                iStack_94 = (int)((long)uVar17 >> 0x21);
                uStack_98 = (undefined4)(uVar17 >> 1);
                local_a8.x = CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1));
              }
              pSVar12 = pSVar12 + -1;
              pcVar10 = pcVar10 + -1;
              lVar15 = local_a8.x;
            }
            local_a8.x = lVar15;
            SVar1 = outline->contours_flag[lVar5];
            stroker->first_point = '\x01';
            local_58->x = local_a8.x;
            local_58->y = local_a8.y;
            stroker->subpath_open = SVar1;
            bVar14 = true;
            if (stroker->line_join == SW_FT_STROKER_LINEJOIN_ROUND) {
              if (SVar1 == '\0') {
                bVar14 = false;
              }
              else {
                bVar14 = stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT;
              }
            }
            stroker->handle_wide_strokes = bVar14;
            local_60->x = local_a8.x;
            local_60->y = local_a8.y;
            stroker->angle_in = 0;
            do {
              while( true ) {
                while( true ) {
                  if (pSVar9 <= pSVar12) goto LAB_0010bfea;
                  pSVar8 = pSVar12 + 1;
                  pcVar11 = pcVar10 + 1;
                  if ((pcVar10[1] & 3U) != 0) break;
                  local_78.x = pSVar8->x;
                  local_78.y = pSVar12[1].y;
                  do {
                    if (pSVar9 <= pSVar8) {
                      SW_FT_Stroker_ConicTo(stroker,&local_78,&local_a8);
                      goto LAB_0010bfea;
                    }
                    local_b8.x = pSVar8[1].x;
                    local_b8.y = pSVar8[1].y;
                    if ((pcVar11[1] & 3U) == 0) {
                      uVar16 = (local_b8.x + local_78.x) - (local_b8.x + local_78.x >> 0x3f);
                      uVar17 = (local_b8.y + local_78.y) - (local_b8.y + local_78.y >> 0x3f);
                      local_88.x = CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1));
                      local_78.x = CONCAT44((int)((long)uVar17 >> 0x21),(int)(uVar17 >> 1));
                      SW_FT_Stroker_ConicTo(stroker,&local_78,&local_88);
                      local_78.x = local_b8.x;
                      local_78.y = local_b8.y;
                      iVar4 = 10;
                    }
                    else {
                      iVar4 = 5;
                      if ((pcVar11[1] & 3U) == 1) {
                        SW_FT_Stroker_ConicTo(stroker,&local_78,&local_b8);
                        iVar4 = 7;
                      }
                    }
                    pSVar8 = pSVar8 + 1;
                    pcVar11 = pcVar11 + 1;
                  } while (iVar4 == 10);
                  outline = local_90;
                  pcVar10 = pcVar11;
                  pSVar12 = pSVar8;
                  if (iVar4 != 7) goto LAB_0010c01c;
                }
                if ((pcVar10[1] & 3U) != 1) break;
                local_b8.x = pSVar8->x;
                local_b8.y = pSVar12[1].y;
                SW_FT_Stroker_LineTo(stroker,&local_b8);
                pcVar10 = pcVar11;
                pSVar12 = pSVar8;
              }
              iVar4 = 5;
              if ((pSVar12 + 2 <= pSVar9) && ((pcVar10[2] & 3U) == 2)) {
                pSVar13 = pSVar12 + 3;
                pcVar11 = pcVar10 + 3;
                local_b8.x = pSVar8->x;
                local_b8.y = pSVar12[1].y;
                local_88.x = pSVar12[2].x;
                local_88.y = pSVar12[2].y;
                pSVar8 = pSVar13;
                if (pSVar9 < pSVar13) {
                  SW_FT_Stroker_CubicTo(stroker,&local_b8,&local_88,&local_a8);
                  iVar4 = 0xb;
                }
                else {
                  local_48.x = pSVar13->x;
                  local_48.y = pSVar12[3].y;
                  SW_FT_Stroker_CubicTo(stroker,&local_b8,&local_88,&local_48);
                  iVar4 = 7;
                }
              }
              pcVar10 = pcVar11;
              pSVar12 = pSVar8;
            } while (iVar4 == 7);
            outline = local_90;
            if (iVar4 == 0xb) {
LAB_0010bfea:
              if (stroker->first_point == '\0') {
                SW_FT_Stroker_EndSubPath(stroker);
              }
              uVar6 = (int)local_50 + 1;
              iVar4 = 0;
              outline = local_90;
            }
          }
        }
        else {
          uVar6 = uVar7 + 1;
          iVar4 = 4;
        }
LAB_0010c01c:
        SVar3 = 0;
        if ((iVar4 != 0) && (iVar4 != 4)) {
          if (iVar4 != 5) {
            return 0;
          }
          return -2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < outline->n_contours);
    }
  }
  return SVar3;
}

Assistant:

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker        stroker,
                                       const SW_FT_Outline* outline)
{
    SW_FT_Vector v_last;
    SW_FT_Vector v_control;
    SW_FT_Vector v_start;

    SW_FT_Vector* point;
    SW_FT_Vector* limit;
    char*         tags;

    SW_FT_Error error;

    SW_FT_Int  n;     /* index of contour in outline     */
    SW_FT_UInt first; /* index of first point in contour */
    SW_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // SW_FT_THROW( Invalid_Argument );

    SW_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        SW_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = SW_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == SW_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == SW_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (SW_FT_CURVE_TAG(outline->tags[last]) == SW_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = SW_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = SW_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case SW_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                SW_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = SW_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case SW_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    SW_FT_Vector vec;
                    SW_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = SW_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == SW_FT_CURVE_TAG_ON) {
                        error =
                            SW_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != SW_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        SW_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = SW_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* SW_FT_CURVE_TAG_CUBIC */
            {
                SW_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    SW_FT_CURVE_TAG(tags[1]) != SW_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    SW_FT_Vector vec;

                    vec = point[0];

                    error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        /* don't try to end the path if no segments have been generated */
        if (!stroker->first_point) {
            error = SW_FT_Stroker_EndSubPath(stroker);
            if (error) goto Exit;
        }

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // SW_FT_THROW( Invalid_Outline );
}